

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

optional<VariableDefinition> * __thiscall
Scope::find(optional<VariableDefinition> *__return_storage_ptr__,Scope *this,string *variableName,
           bool canCrossFunctionBarrier)

{
  bool bVar1;
  undefined8 uVar2;
  undefined7 in_register_00000009;
  bool considerPartiallyBound;
  bool considerPartiallyBound_00;
  Scope *pSVar3;
  undefined1 local_58 [8];
  optional<VariableDefinition> find;
  
  find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
  super__Optional_payload<VariableDefinition,_true,_false,_false>.
  super__Optional_payload_base<VariableDefinition>._28_4_ =
       SUB84(CONCAT71(in_register_00000009,canCrossFunctionBarrier),0);
  considerPartiallyBound_00 = false;
  do {
    findLocally((optional<VariableDefinition> *)local_58,this,variableName,considerPartiallyBound_00
               );
    uVar2 = find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
            super__Optional_payload<VariableDefinition,_true,_false,_false>.
            super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
            super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == true) {
      (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_engaged = false;
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
        super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> = local_58;
      bVar1 = false;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>).
              _M_payload.super__Optional_payload<VariableDefinition,_true,_false,_false>.
              super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
              super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
      super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>).
              _M_payload.super__Optional_payload<VariableDefinition,_true,_false,_false>.
              super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
              super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      local_58 = (undefined1  [8])0x0;
      (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound =
           (bool)find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                 super__Optional_payload<VariableDefinition,_true,_false,_false>.
                 super__Optional_payload_base<VariableDefinition>._M_payload._8_1_;
      (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_engaged = true;
      pSVar3 = this;
    }
    else {
      pSVar3 = (this->outerScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pSVar3 != (Scope *)0x0) {
        if (this->outerScopeCrossesFunctionBarrier != false) {
          considerPartiallyBound_00 = true;
        }
        bVar1 = true;
        if ((find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
             super__Optional_payload<VariableDefinition,_true,_false,_false>.
             super__Optional_payload_base<VariableDefinition>._28_1_ != '\0') ||
           (this->outerScopeCrossesFunctionBarrier == false)) goto LAB_001121ca;
      }
      (__return_storage_ptr__->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_engaged = false;
      bVar1 = false;
      pSVar3 = this;
    }
LAB_001121ca:
    if ((find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
         super__Optional_payload<VariableDefinition,_true,_false,_false>.
         super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound != false)
       && (find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
           super__Optional_payload<VariableDefinition,_true,_false,_false>.
           super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound = false
          , find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
            super__Optional_payload<VariableDefinition,_true,_false,_false>.
            super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
            super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                 super__Optional_payload<VariableDefinition,_true,_false,_false>.
                 super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
                 super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    this = pSVar3;
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::optional<VariableDefinition> find(const std::string & variableName, bool canCrossFunctionBarrier) {

    Scope* scopeToSearch = this;

    bool considerPartiallyBound = false;

    while (true) {
      auto find = scopeToSearch->findLocally(variableName, considerPartiallyBound);

      if (find) {
        return find;
      }

      if (scopeToSearch->outerScope != nullptr) {
        if (scopeToSearch->outerScopeCrossesFunctionBarrier) {
          considerPartiallyBound = true;
        }

        if (!canCrossFunctionBarrier && scopeToSearch->outerScopeCrossesFunctionBarrier) {
          return std::nullopt;

        } else {
          scopeToSearch = scopeToSearch->outerScope.get();
        }
      } else {
        return std::nullopt;
      }
    }
  }